

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O1

double HTS_b2en(HTS_Vocoder *v,double *b,int m,double a)

{
  long lVar1;
  double dVar2;
  double *c1;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  double dVar9;
  
  uVar6 = (ulong)(uint)m;
  if (v->spectrum2en_size < uVar6) {
    if (v->spectrum2en_buff != (double *)0x0) {
      HTS_free(v->spectrum2en_buff);
    }
    pdVar3 = (double *)HTS_calloc((ulong)(m + 0x481),8);
    v->spectrum2en_buff = pdVar3;
    v->spectrum2en_size = uVar6;
  }
  c1 = v->spectrum2en_buff;
  pdVar3 = c1 + uVar6;
  pdVar8 = c1 + uVar6 + 0x241;
  dVar9 = b[uVar6];
  *pdVar3 = dVar9;
  if (0 < m) {
    lVar4 = uVar6 + 1;
    do {
      dVar2 = b[lVar4 + -2];
      c1[lVar4 + -2] = dVar9 * a + dVar2;
      lVar4 = lVar4 + -1;
      dVar9 = dVar2;
    } while (1 < lVar4);
  }
  HTS_freqt(v,c1,m,pdVar3 + 1,0x23f,-a);
  dVar9 = exp(pdVar3[1]);
  *pdVar8 = dVar9;
  lVar4 = 1;
  pdVar3 = pdVar8;
  do {
    dVar9 = 0.0;
    pdVar5 = pdVar3;
    lVar7 = 0;
    do {
      lVar1 = lVar7 + 1;
      dVar9 = dVar9 + (double)(int)lVar1 * c1[uVar6 + lVar7 + 2] * *pdVar5;
      pdVar5 = pdVar5 + -1;
      lVar7 = lVar1;
    } while (lVar4 != lVar1);
    pdVar8[lVar4] = dVar9 / (double)(int)lVar4;
    lVar4 = lVar4 + 1;
    pdVar3 = pdVar3 + 1;
  } while (lVar4 != 0x240);
  dVar9 = 0.0;
  lVar4 = 0;
  do {
    dVar9 = dVar9 + pdVar8[lVar4] * pdVar8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x240);
  return dVar9;
}

Assistant:

static double HTS_b2en(HTS_Vocoder * v, const double *b, const int m, const double a)
{
   int i;
   double en = 0.0;
   double *cep;
   double *ir;

   if (v->spectrum2en_size < m) {
      if (v->spectrum2en_buff != NULL)
         HTS_free(v->spectrum2en_buff);
      v->spectrum2en_buff = (double *) HTS_calloc((m + 1) + 2 * IRLENG, sizeof(double));
      v->spectrum2en_size = m;
   }
   cep = v->spectrum2en_buff + m + 1;
   ir = cep + IRLENG;

   HTS_b2mc(b, v->spectrum2en_buff, m, a);
   HTS_freqt(v, v->spectrum2en_buff, m, cep, IRLENG - 1, -a);
   HTS_c2ir(cep, IRLENG, ir, IRLENG);

   for (i = 0; i < IRLENG; i++)
      en += ir[i] * ir[i];

   return (en);
}